

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O0

Source * __thiscall
Hpipe::Pool<Hpipe::Source,32>::New<char_const(&)[22],char(&)[6897],bool>
          (Pool<Hpipe::Source,32> *this,char (*args) [22],char (*args_1) [6897],bool *args_2)

{
  int iVar1;
  void *pvVar2;
  Source *this_00;
  Set *n;
  bool *args_local_2;
  char (*args_local_1) [6897];
  char (*args_local) [22];
  Pool<Hpipe::Source,_32> *this_local;
  
  if (*(int *)(this + 8) == 0x20) {
    pvVar2 = operator_new(0x408);
    *(undefined8 *)((long)pvVar2 + 0x400) = *(undefined8 *)this;
    *(void **)this = pvVar2;
    *(undefined4 *)(this + 8) = 0;
  }
  iVar1 = *(int *)(this + 8);
  *(int *)(this + 8) = iVar1 + 1;
  this_00 = (Source *)(*(long *)this + (long)iVar1 * 0x20);
  Source::Source(this_00,*args,*args_1,(bool)(*args_2 & 1));
  return this_00;
}

Assistant:

T *New( Args&&... args ) {
        if ( used == s ) {
            Set *n = new Set;
            n->prev = last;
            last = n;
            used = 0;
        }
        return new ( last->items + sizeof( T ) * used++ ) T( std::forward<Args>( args )... );
    }